

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O0

VolumeMeshCellVectorQuantity * __thiscall
polyscope::VolumeMesh::addCellVectorQuantityImpl
          (VolumeMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  VolumeMeshCellVectorQuantity *pVVar1;
  string *in_RSI;
  bool in_stack_00000047;
  string *in_stack_00000048;
  QuantityStructure<polyscope::VolumeMesh> *in_stack_00000050;
  VolumeMeshCellVectorQuantity *q;
  string *this_00;
  string local_78 [12];
  VectorType in_stack_ffffffffffffff94;
  undefined1 allowReplacement;
  VolumeMesh *in_stack_ffffffffffffff98;
  QuantityStructure<polyscope::VolumeMesh> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  VolumeMeshCellVectorQuantity *in_stack_ffffffffffffffb0;
  string local_40 [64];
  
  this_00 = local_40;
  std::__cxx11::string::string(this_00,in_RSI);
  QuantityStructure<polyscope::VolumeMesh>::checkForQuantityWithNameAndDeleteOrError
            (in_stack_00000050,in_stack_00000048,in_stack_00000047);
  std::__cxx11::string::~string(local_40);
  pVVar1 = (VolumeMeshCellVectorQuantity *)operator_new(0x3a8);
  std::__cxx11::string::string(local_78,in_RSI);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)in_stack_ffffffffffffffa0,
           (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)in_stack_ffffffffffffff98);
  VolumeMeshCellVectorQuantity::VolumeMeshCellVectorQuantity
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  allowReplacement = (undefined1)(in_stack_ffffffffffffff94 >> 0x18);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)this_00);
  std::__cxx11::string::~string(local_78);
  QuantityStructure<polyscope::VolumeMesh>::addQuantity
            (in_stack_ffffffffffffffa0,(QuantityType *)in_stack_ffffffffffffff98,
             (bool)allowReplacement);
  return pVVar1;
}

Assistant:

VolumeMeshCellVectorQuantity*
VolumeMesh::addCellVectorQuantityImpl(std::string name, const std::vector<glm::vec3>& vectors, VectorType vectorType) {

  checkForQuantityWithNameAndDeleteOrError(name);
  VolumeMeshCellVectorQuantity* q = new VolumeMeshCellVectorQuantity(name, vectors, *this, vectorType);
  addQuantity(q);
  return q;
}